

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

LY_ERR lyd_path_leaflist_predicate
                 (lyd_node *node,char **buffer,size_t *buflen,size_t *bufused,ly_bool is_static)

{
  lysc_node *plVar1;
  int iVar2;
  lyd_node *__s;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  ulong size;
  size_t sVar7;
  
  if (node != (lyd_node *)0x0) {
    plVar1 = node->schema;
    if (plVar1 == (lysc_node *)0x0) {
      __s = node[1].prev;
      goto LAB_00123242;
    }
    if ((plVar1->nodetype & 0xc) != 0) {
      __s = *(lyd_node **)(node + 1);
      if (__s == (lyd_node *)0x0) {
        __s = (lyd_node *)lyd_value_get_canonical(plVar1->module->ctx,(lyd_value *)(node + 1));
      }
      goto LAB_00123242;
    }
  }
  __s = (lyd_node *)0x0;
LAB_00123242:
  sVar3 = strlen((char *)__s);
  sVar7 = *bufused;
  size = sVar3 + sVar7 + 7;
  if (*buflen < size) {
    if (is_static != '\0') {
      return LY_EINCOMPLETE;
    }
    pcVar4 = (char *)ly_realloc(*buffer,size);
    *buffer = pcVar4;
    if (pcVar4 == (char *)0x0) {
      return LY_EMEM;
    }
    *buflen = size;
    sVar7 = *bufused;
  }
  else {
    pcVar4 = *buffer;
  }
  pcVar5 = strchr((char *)__s,0x27);
  uVar6 = (uint)(pcVar5 == (char *)0x0) * 5 + 0x22;
  iVar2 = sprintf(pcVar4 + sVar7,"[.=%c%s%c]",(ulong)uVar6,__s,(ulong)uVar6);
  *bufused = *bufused + (long)iVar2;
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyd_path_leaflist_predicate(const struct lyd_node *node, char **buffer, size_t *buflen, size_t *bufused, ly_bool is_static)
{
    size_t len;
    const char *val;
    char quot;

    val = lyd_get_value(node);
    len = 4 + strlen(val) + 2; /* "[.='" + val + "']" */
    LY_CHECK_RET(lyd_path_str_enlarge(buffer, buflen, *bufused + len, is_static));

    quot = '\'';
    if (strchr(val, '\'')) {
        quot = '"';
    }
    *bufused += sprintf(*buffer + *bufused, "[.=%c%s%c]", quot, val, quot);

    return LY_SUCCESS;
}